

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

void __thiscall
cmConditionEvaluator::cmArgumentList::
ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
          (cmArgumentList *this,bool value,CurrentAndNextIter args)

{
  reference this_00;
  const_iterator local_88 [3];
  string local_70;
  cmExpandedCommandArgument local_50;
  undefined1 local_21;
  cmArgumentList *pcStack_20;
  bool value_local;
  cmArgumentList *this_local;
  CurrentAndNextIter args_local;
  
  args_local.current = args.next._M_node;
  this_local = (cmArgumentList *)args.current._M_node;
  local_21 = value;
  pcStack_20 = this;
  (anonymous_namespace)::bool2string_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)(ulong)(value & 1),args.current._M_node._0_1_);
  cmExpandedCommandArgument::cmExpandedCommandArgument(&local_50,&local_70,true);
  this_00 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                      ((_List_iterator<cmExpandedCommandArgument> *)&this_local);
  cmExpandedCommandArgument::operator=(this_00,&local_50);
  cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
            (local_88,&args_local.current);
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
            (&this->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>,
             local_88[0]);
  return;
}

Assistant:

void ReduceOneArg(const bool value, Iter args)
  {
    *args.current = cmExpandedCommandArgument(bool2string(value), true);
    this->erase(args.next);
  }